

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

int __thiscall
CRegexParser::break_loops
          (CRegexParser *this,re_state_id init,re_state_id final,regex_scan_frame *stack)

{
  re_tuple *prVar1;
  int iVar2;
  regex_scan_frame local_38;
  
  local_38.parent = stack;
  do {
    if (init == final) {
      return 0;
    }
    prVar1 = this->tuple_arr_;
    local_38.st = init;
    switch(prVar1[init].typ) {
    case RE_EPSILON:
      if (prVar1[init].next_state_2 != -1) {
        iVar2 = regex_scan_frame::is_recursing(&local_38);
        if (iVar2 == 0) {
          iVar2 = break_loops(this,prVar1[init].next_state_2,final,&local_38);
          if (iVar2 != 0) {
            prVar1[init].next_state_2 = -1;
          }
          iVar2 = break_loops(this,prVar1[init].next_state_1,final,&local_38);
          if (iVar2 == 0) {
            iVar2 = prVar1[init].next_state_1;
          }
          else {
            iVar2 = prVar1[init].next_state_2;
            prVar1[init].next_state_1 = iVar2;
            prVar1[init].next_state_2 = -1;
          }
          return (uint)(iVar2 == -1);
        }
        return 1;
      }
    case RE_GROUP_ENTER:
    case RE_GROUP_EXIT:
      init = prVar1[init].next_state_1;
      if (init == -1) {
switchD_0026d922_caseD_5:
        return 0;
      }
      break;
    case RE_WILDCARD:
    case RE_WORD_CHAR:
    case RE_NON_WORD_CHAR:
    case RE_RANGE:
    case RE_RANGE_EXCL:
    case RE_GROUP_MATCH:
    case RE_ALPHA:
    case RE_DIGIT:
    case RE_NON_DIGIT:
    case RE_UPPER:
    case RE_LOWER:
    case RE_ALPHANUM:
    case RE_SPACE:
    case RE_NON_SPACE:
    case RE_PUNCT:
    case RE_NEWLINE:
    case RE_NULLCHAR:
      goto switchD_0026d922_caseD_5;
    case RE_ASSERT_POS:
    case RE_ASSERT_NEG:
    case RE_ASSERT_BACKPOS:
    case RE_ASSERT_BACKNEG:
      iVar2 = break_loops(this,prVar1[init].info.sub.init,prVar1[init].info.sub.final,
                          (regex_scan_frame *)0x0);
      if (iVar2 != 0) {
        prVar1[init].info.ch = prVar1[init].info.sub.final;
      }
    case RE_TEXT_BEGIN:
    case RE_TEXT_END:
    case RE_LOOKBACK_POS:
    case RE_WORD_BEGIN:
    case RE_WORD_END:
    case RE_WORD_BOUNDARY:
    case RE_NON_WORD_BOUNDARY:
    case RE_ZERO_VAR:
      init = prVar1[init].next_state_1;
      break;
    default:
      return 0;
    }
  } while( true );
}

Assistant:

int CRegexParser::break_loops(re_state_id init, re_state_id final,
                              regex_scan_frame *stack)
{
    /* set up the scan frame for this level */
    regex_scan_frame fr(stack);
        
    /* scan the chain of states from the current state */
    for (re_state_id cur_state = init ; ; )
    {
        /* if this is the final state, we're done */
        if (cur_state == final)
            return FALSE;

        /* get the tuple for this state */
        re_tuple *tuple = &tuple_arr_[cur_state];

        /* set the current state in the recursion frame */
        fr.st = cur_state;

        /* if it's a two-transition epsilon state, recurse */
        if (tuple->typ == RE_EPSILON
            && tuple->next_state_2 != RE_STATE_INVALID)
        {
            /* 
             *   This is a branching state, so we need to recursively break
             *   loops in each branch.  If we're looping on the current
             *   state, tell the caller that this whole branch is a loop.
             */
            if (fr.is_recursing())
                return TRUE;

            /* try breaking loops in the first branch */
            if (break_loops(tuple->next_state_2, final, &fr))
            {
                /* the second branch loops - skip it */
                tuple->next_state_2 = RE_STATE_INVALID;
            }
            
            /* check the other branch */
            if (break_loops(tuple->next_state_1, final, &fr))
            {
                /* 
                 *   the first branch loops - move the second branch to
                 *   the first slot, and clear the second slot (if we only
                 *   have one branch, it must always be in the first slot) 
                 */
                tuple->next_state_1 = tuple->next_state_2;
                tuple->next_state_2 = RE_STATE_INVALID;
            }

            /* 
             *   If both branches loop, this entire state is a loop, so tell
             *   the caller to break its branch to here.  Otherwise, we've
             *   finished with the rest of this chain.  
             */
            return (tuple->next_state_1 == RE_STATE_INVALID);
        }

        /* see what kind of transition this is */
        switch(tuple->typ)
        {
        case RE_EPSILON:
        case RE_GROUP_ENTER:
        case RE_GROUP_EXIT:
            /* 
             *   epsilon or group transition - this could definitely be part
             *   of a loop, so move on to the next state and keep looking 
             */
            cur_state = tuple->next_state_1;

            /* 
             *   if this took us to an invalid state, we must have reached
             *   the final state of a sub-machine - we can go no further
             *   from here, so there are no loops in this branch 
             */
            if (cur_state == RE_STATE_INVALID)
                return FALSE;
            break;

        case RE_TEXT_BEGIN:
        case RE_TEXT_END:
        case RE_LOOKBACK_POS:
        case RE_WORD_BEGIN:
        case RE_WORD_END:
        case RE_WORD_BOUNDARY:
        case RE_NON_WORD_BOUNDARY:
        case RE_ZERO_VAR:
            /* 
             *   none of these transitions consumes input, so any of these
             *   could result in an infinite loop - continue down the
             *   current path 
             */
            cur_state = tuple->next_state_1;
            break;

        case RE_ASSERT_POS:
        case RE_ASSERT_NEG:
        case RE_ASSERT_BACKPOS:
        case RE_ASSERT_BACKNEG:
            /*
             *   Assertions have sub-machines that are independent of the
             *   main machine - there are no state transitions between the
             *   main machine and a sub-machine.  Break loops in the
             *   sub-machine recursively.  Note that this is a whole new loop
             *   break test - we don't share the stack with the enclosing
             *   machine.  
             */
            if (break_loops(tuple->info.sub.init, tuple->info.sub.final, 0))
            {
                /* 
                 *   The whole sub-machine was a loop, which makes it an
                 *   automatic zero-length match - jump immediately to its
                 *   final state on evaluation.  
                 */
                tuple->info.sub.init = tuple->info.sub.final;
            }

            /* assertions don't consume input, so continue on this path */
            cur_state = tuple->next_state_1;
            break;

        default:
            /* 
             *   all other states consume input, so this branch definitely
             *   can't loop back to the original state without consuming
             *   input - we do not need to proceed any further down the
             *   current branch, since it's not an infinite epsilon loop
             *   even if it does ultimately find its way back to the
             *   initial state 
             */
            return FALSE;
        }
    }
}